

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAig.c
# Opt level: O2

Aig_Man_t * Gia_ManToAigSimple(Gia_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  void *__s;
  Aig_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pObj;
  Aig_Obj_t *pAVar5;
  uint uVar6;
  size_t __size;
  ulong uVar7;
  
  iVar3 = p->nObjs;
  __size = (long)iVar3 << 3;
  __s = malloc(__size);
  memset(__s,0xff,__size);
  p_00 = Aig_ManStart(iVar3);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  p_00->nConstrs = p->nConstrs;
  for (uVar7 = 0; (long)uVar7 < (long)p->nObjs; uVar7 = uVar7 + 1) {
    pObj = Gia_ManObj(p,(int)uVar7);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar1 = *(ulong *)pObj;
    uVar2 = (uint)uVar1;
    if ((uVar1 & 0x1fffffff) == 0x1fffffff || (int)uVar2 < 0) {
      if ((~uVar2 & 0x9fffffff) == 0) {
        pAVar5 = Aig_ObjCreateCi(p_00);
      }
      else if ((int)uVar2 < 0 && (int)(uVar1 & 0x1fffffff) != 0x1fffffff) {
        iVar3 = Gia_ObjId(p,pObj);
        pAVar5 = Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                      ((ulong)(*(uint *)pObj >> 0x1d & 1) ^
                                      *(ulong *)((long)__s +
                                                (long)(int)(iVar3 - (*(uint *)pObj & 0x1fffffff)) *
                                                8)));
      }
      else {
        if ((~uVar1 & 0x1fffffff1fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAig.c"
                        ,0x188,"Aig_Man_t *Gia_ManToAigSimple(Gia_Man_t *)");
        }
        pAVar5 = (Aig_Obj_t *)((ulong)p_00->pConst1 ^ 1);
      }
    }
    else {
      iVar3 = Gia_ObjId(p,pObj);
      uVar2 = *(uint *)pObj;
      uVar1 = *(ulong *)((long)__s + (long)(int)(iVar3 - (uVar2 & 0x1fffffff)) * 8);
      iVar3 = Gia_ObjId(p,pObj);
      uVar6 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
      pAVar5 = Aig_And(p_00,(Aig_Obj_t *)(uVar2 >> 0x1d & 1 ^ uVar1),
                       (Aig_Obj_t *)
                       ((ulong)(uVar6 >> 0x1d & 1) ^
                       *(ulong *)((long)__s + (long)(int)(iVar3 - (uVar6 & 0x1fffffff)) * 8)));
    }
    *(Aig_Obj_t **)((long)__s + uVar7 * 8) = pAVar5;
    iVar3 = *(int *)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x24);
    if (iVar3 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    pObj->Value = ((uint)pAVar5 & 1) + iVar3 * 2;
    if ((uVar7 != 0) && (uVar7 != (uint)pAVar5->Id)) {
      __assert_fail("i == 0 || Aig_ObjId(ppNodes[i]) == i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAig.c"
                    ,0x18a,"Aig_Man_t *Gia_ManToAigSimple(Gia_Man_t *)");
    }
  }
  Aig_ManSetRegNum(p_00,p->nRegs);
  free(__s);
  return p_00;
}

Assistant:

Aig_Man_t * Gia_ManToAigSimple( Gia_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t ** ppNodes;
    Gia_Obj_t * pObj;
    int i;
    ppNodes = ABC_FALLOC( Aig_Obj_t *, Gia_ManObjNum(p) );
    // create the new manager
    pNew = Aig_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nConstrs = p->nConstrs;
    // create the PIs
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            ppNodes[i] = Aig_And( pNew, Gia_ObjChild0Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)), Gia_ObjChild1Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)) );
        else if ( Gia_ObjIsCi(pObj) )
            ppNodes[i] = Aig_ObjCreateCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            ppNodes[i] = Aig_ObjCreateCo( pNew, Gia_ObjChild0Copy2(ppNodes, pObj, Gia_ObjId(p, pObj)) );
        else if ( Gia_ObjIsConst0(pObj) )
            ppNodes[i] = Aig_ManConst0(pNew);
        else
            assert( 0 );
        pObj->Value = Abc_Var2Lit( Aig_ObjId(Aig_Regular(ppNodes[i])), Aig_IsComplement(ppNodes[i]) );
        assert( i == 0 || Aig_ObjId(ppNodes[i]) == i );
    }
    Aig_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    ABC_FREE( ppNodes );
    return pNew;
}